

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O1

box SIVIA_dyn(box *P0,deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                      *d_all_mes_vector,deque<double,_std::allocator<double>_> *alpha_mes_vector,
             deque<double,_std::allocator<double>_> *t_history_vector,
             deque<interval,_std::allocator<interval>_> *xhat_history_vector,
             deque<interval,_std::allocator<interval>_> *yhat_history_vector,
             deque<interval,_std::allocator<interval>_> *psihat_history_vector,
             deque<interval,_std::allocator<interval>_> *vrxhat_history_vector,double *d_max_err,
             double *alpha_max_err,int *sdir,interval *alphashat,
             vector<double,_std::allocator<double>_> *walls_xa,
             vector<double,_std::allocator<double>_> *walls_ya,
             vector<double,_std::allocator<double>_> *walls_xb,
             vector<double,_std::allocator<double>_> *walls_yb,
             vector<double,_std::allocator<double>_> *circles_x,
             vector<double,_std::allocator<double>_> *circles_y,
             vector<double,_std::allocator<double>_> *circles_r)

{
  bool bVar1;
  _Node *p_Var2;
  undefined8 extraout_RDX;
  int iVar3;
  box bVar4;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  list<box,_std::allocator<box>_> L;
  box P2;
  box P1;
  vector<box,_std::allocator<box>_> Result;
  box local_40;
  
  L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&L;
  L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node._M_size = 0;
  Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node.super__List_node_base._M_prev =
       L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node.super__List_node_base._M_next;
  box::box(P0);
  box::box(&P1);
  box::box(&P2);
  p_Var2 = std::__cxx11::list<box,std::allocator<box>>::_M_create_node<box_const&>
                     ((list<box,std::allocator<box>> *)&L,(box *)d_all_mes_vector);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node._M_size =
       L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node._M_size + 1;
  if (L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node.super__List_node_base._M_next !=
      (_List_node_base *)&L) {
    iVar3 = 0;
    do {
      box::operator=(P0,(box *)(L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node.
                                super__List_node_base._M_next + 1));
      std::__cxx11::list<box,_std::allocator<box>_>::_M_erase
                (&L,(iterator)
                    L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node.
                    super__List_node_base._M_next);
      Contract_dyn(P0,(deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                       *)alpha_mes_vector,t_history_vector,
                   (deque<double,_std::allocator<double>_> *)xhat_history_vector,yhat_history_vector
                   ,psihat_history_vector,vrxhat_history_vector,
                   (deque<interval,_std::allocator<interval>_> *)d_max_err,alpha_max_err,
                   (double *)sdir,(int *)alphashat,(interval *)walls_xa,walls_ya,walls_xb,walls_yb,
                   circles_x,circles_y,circles_r,in_stack_00000070);
      bVar1 = box::IsEmpty(P0);
      if (!bVar1) {
        if (iVar3 < 0xb) {
          Bisect(P0,&P1,&P2);
          p_Var2 = std::__cxx11::list<box,std::allocator<box>>::_M_create_node<box_const&>
                             ((list<box,std::allocator<box>> *)&L,&P1);
          std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
          L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node._M_size =
               L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node._M_size + 1;
          p_Var2 = std::__cxx11::list<box,std::allocator<box>>::_M_create_node<box_const&>
                             ((list<box,std::allocator<box>> *)&L,&P2);
          std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
          L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node._M_size =
               L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node._M_size + 1;
          iVar3 = iVar3 + 1;
        }
        else {
          std::vector<box,_std::allocator<box>_>::push_back(&Result,P0);
        }
      }
    } while (L.super__List_base<box,_std::allocator<box>_>._M_impl._M_node.super__List_node_base.
             _M_next != (_List_node_base *)&L);
  }
  Union((vector<box,_std::allocator<box>_> *)&local_40);
  box::operator=(P0,&local_40);
  box::~box(&local_40);
  box::~box(&P2);
  box::~box(&P1);
  std::vector<box,_std::allocator<box>_>::~vector(&Result);
  std::__cxx11::_List_base<box,_std::allocator<box>_>::_M_clear
            (&L.super__List_base<box,_std::allocator<box>_>);
  bVar4._8_8_ = extraout_RDX;
  bVar4.data = (interval *)P0;
  return bVar4;
}

Assistant:

inline box SIVIA_dyn(box P0, deque< vector<interval> >& d_all_mes_vector, deque<double>& alpha_mes_vector, 
						 deque<double>& t_history_vector, deque<interval>& xhat_history_vector, deque<interval>& yhat_history_vector, 
						 deque<interval>& psihat_history_vector, deque<interval>& vrxhat_history_vector, 
						 double& d_max_err, double& alpha_max_err, int& sdir, interval& alphashat, 
						 vector<double>& walls_xa, vector<double>& walls_ya, vector<double>& walls_xb, vector<double>& walls_yb, 
						 vector<double>& circles_x, vector<double>& circles_y, vector<double>& circles_r)
{   
	list<box> L;
	vector<box> Result;
	box P, P1, P2;
	int nb_bisections = 0;

	L.push_back(P0);
	while (!L.empty())
	{ 
		P = L.front();
		L.pop_front();

		Contract_dyn(P, d_all_mes_vector, alpha_mes_vector, 
			t_history_vector, xhat_history_vector, yhat_history_vector, 
			psihat_history_vector, vrxhat_history_vector,
			d_max_err, alpha_max_err, sdir, alphashat, 
			walls_xa, walls_ya, walls_xb, walls_yb, 
			circles_x, circles_y, circles_r);

		if (!P.IsEmpty())
		{  
			//if (P.Width() < 0.1)
			if (nb_bisections > 10)
			{

				/*				//
				COORDSYSTEM2IMG csMap2FullImg;

				InitCS2ImgEx(&csMap2FullImg, &csMap, imgwidth, imgheight, BEST_RATIO_COORDSYSTEM2IMG);

				cvRectangle(img, 
				cvPoint(
				XCS2JImg(&csMap2FullImg, Center(P[1])-0.5*Width(P[1])), 
				YCS2IImg(&csMap2FullImg, Center(P[2])-0.5*Width(P[2]))), 
				cvPoint(
				XCS2JImg(&csMap2FullImg, Center(P[1])+0.5*Width(P[1])), 
				YCS2IImg(&csMap2FullImg, Center(P[2])+0.5*Width(P[2]))), 
				CV_RGB_CvScalar(0, 128, 128), CV_FILLED, 8, 0);
				cvRectangle(img, 
				cvPoint(
				XCS2JImg(&csMap2FullImg, Center(P[1])-0.5*Width(P[1])), 
				YCS2IImg(&csMap2FullImg, Center(P[2])-0.5*Width(P[2]))), 
				cvPoint(
				XCS2JImg(&csMap2FullImg, Center(P[1])+0.5*Width(P[1])), 
				YCS2IImg(&csMap2FullImg, Center(P[2])+0.5*Width(P[2]))), 
				CV_RGB_CvScalar(0, 255, 255), 1, 8, 0);
				*/				//

				Result.push_back(P);
			}
			else  
			{   
				Bisect(P, P1, P2);
				L.push_back(P1);
				L.push_back(P2);
				nb_bisections++;
			}
		}
	}

	P = Union(Result);
	//printf("nb_bisections = %d\n", nb_bisections);

	return P;
}